

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O1

void __thiscall SSD1306::OledI2C::OledI2C(OledI2C *this,string *device,uint8_t address)

{
  FileDescriptor *this_00;
  uchar *puVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  system_error *psVar5;
  int *piVar6;
  error_category *peVar7;
  size_type *psVar8;
  EVP_PKEY_CTX *ctx;
  string what;
  string local_120;
  FileDescriptor local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  (this->super_OledHardware)._vptr_OledHardware = (_func_int **)&PTR__OledI2C_00109b90;
  (this->super_OledPixel)._vptr_OledPixel = (_func_int **)&PTR__OledI2C_00109c20;
  this_00 = &this->fd_;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_manager;
  FileDescriptor::FileDescriptor(this_00,-1,(CloseIfFunction *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  memset(&this->blocks_,0,0x440);
  lVar3 = 0x59;
  do {
    puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + lVar3 + -0x59;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + lVar3 + -0x49;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + lVar3 + -0x39;
    puVar1[0] = '\0';
    puVar1[1] = '\x01';
    (this->blocks_)._M_elems[0].bytes_._M_elems[lVar3 + -0x59] = '@';
    lVar3 = lVar3 + 0x22;
  } while (lVar3 != 0x499);
  iVar2 = open((device->_M_dataplus)._M_p,2);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_SSD1306::FileDescriptor::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.h:52:36)>
             ::_M_manager;
  FileDescriptor::FileDescriptor(&local_100,iVar2,(CloseIfFunction *)&local_78);
  FileDescriptor::operator=(this_00,&local_100);
  FileDescriptor::~FileDescriptor(&local_100);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (this_00->fd_ != -1) {
    ctx = (EVP_PKEY_CTX *)0x703;
    iVar2 = ioctl(this_00->fd_,0x703,(ulong)address);
    if (iVar2 != -1) {
      init(this,ctx);
      return;
    }
    std::__cxx11::to_string(&local_120,0x80);
    std::operator+(&local_d8,
                   "ioctl I2C_SLAVE /workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/OledI2C.cxx("
                   ,&local_120);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_100._0_8_ = *plVar4;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_100._0_8_ == psVar8) {
      local_100.close_if_.super__Function_base._M_functor._8_8_ = *psVar8;
      local_100.close_if_.super__Function_base._M_manager = (_Manager_type)plVar4[3];
      local_100._0_8_ = (long)local_100.close_if_.super__Function_base._M_functor._M_pod_data + 8;
    }
    else {
      local_100.close_if_.super__Function_base._M_functor._8_8_ = *psVar8;
    }
    local_100.close_if_.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    psVar5 = (system_error *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    peVar7 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar5,iVar2,peVar7,(string *)&local_100);
    __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::operator+(&local_98,"open ",device);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_120._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_120._M_dataplus._M_p == psVar8) {
    local_120.field_2._M_allocated_capacity = *psVar8;
    local_120.field_2._8_8_ = plVar4[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar8;
  }
  local_120._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_b8,0x78);
  std::operator+(&local_d8,&local_120,&local_b8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_100._0_8_ = *plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_100._0_8_ == psVar8) {
    local_100.close_if_.super__Function_base._M_functor._8_8_ = *psVar8;
    local_100.close_if_.super__Function_base._M_manager = (_Manager_type)plVar4[3];
    local_100._0_8_ = (long)local_100.close_if_.super__Function_base._M_functor._M_pod_data + 8;
  }
  else {
    local_100.close_if_.super__Function_base._M_functor._8_8_ = *psVar8;
  }
  local_100.close_if_.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  psVar5 = (system_error *)__cxa_allocate_exception(0x20);
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  peVar7 = (error_category *)std::_V2::system_category();
  std::system_error::system_error(psVar5,iVar2,peVar7,(string *)&local_100);
  __cxa_throw(psVar5,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

SSD1306::OledI2C::OledI2C(
    const std::string& device,
    uint8_t address)
:
    fd_{-1},
    blocks_{}
{
    fd_ = FileDescriptor{::open(device.c_str(), O_RDWR)};

    if (fd_.fd() == -1)
    {
        std::string what( "open "
                        + device
                        + " " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }

    if (ioctl(fd_.fd(), I2C_SLAVE, address) == -1)
    {
        std::string what( "ioctl I2C_SLAVE " __FILE__ "("
                        + std::to_string(__LINE__)
                        + ")" );
        throw std::system_error(errno, std::system_category(), what);
    }

    init();
}